

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *ranlib;
  string *toDestDirPath_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  ranlib = toDestDirPath;
  toDestDirPath_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar2 == STATIC_LIBRARY) && (bVar1 = cmGeneratorTarget::IsApple(this->Target), bVar1)) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"CMAKE_RANLIB",&local_51)
    ;
    psVar3 = cmMakefile::GetRequiredDefinition(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = psVar3;
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar5 = ::operator<<((ostream *)toDestDirPath_local,(cmScriptGeneratorIndent)this_local._4_4_
                           );
      poVar5 = std::operator<<(poVar5,"execute_process(COMMAND \"");
      poVar5 = std::operator<<(poVar5,(string *)local_30);
      poVar5 = std::operator<<(poVar5,"\" \"");
      poVar5 = std::operator<<(poVar5,(string *)ranlib);
      std::operator<<(poVar5,"\")\n");
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRanlibRule(std::ostream& os, Indent indent,
                                             const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if (this->Target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    return;
  }

  // Perform post-installation processing on the file depending
  // on its type.
  if (!this->Target->IsApple()) {
    return;
  }

  const std::string& ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if (ranlib.empty()) {
    return;
  }

  os << indent << "execute_process(COMMAND \"" << ranlib << "\" \""
     << toDestDirPath << "\")\n";
}